

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

bool crnlib::rg_etc1::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint16 packed_delta3,uint table_idx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  component_t cVar8;
  ulong uVar9;
  color_quad_u8 result;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_2c;
  
  uVar9 = (ulong)table_idx;
  bVar1 = unpack_color5((color_quad_u8 *)&local_2c.field_0,packed_color5,packed_delta3,true,0xff);
  uVar3 = (uint)local_2c.field_0.r;
  uVar2 = (uint)local_2c.field_0.g;
  iVar5 = (&g_etc1_inten_tables)[uVar9 * 4];
  iVar7 = iVar5 + uVar3;
  iVar4 = iVar5 + uVar2;
  iVar5 = iVar5 + (uint)local_2c.field_0.b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  iVar6 = (&DAT_001ae234)[uVar9 * 4];
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  (pDst->field_0).field_0.r = (component_t)iVar7;
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  (pDst->field_0).field_0.g = (component_t)iVar4;
  (pDst->field_0).field_0.b = (component_t)iVar5;
  iVar7 = iVar6 + uVar3;
  iVar4 = iVar6 + uVar2;
  iVar6 = iVar6 + (uint)local_2c.field_0.b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  (pDst->field_0).field_0.a = 0xff;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar7;
  cVar8 = (component_t)iVar4;
  if (0xfe < iVar4) {
    cVar8 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar8;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  cVar8 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar8 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar8;
  pDst[1].field_0.field_0.a = 0xff;
  iVar5 = *(int *)(&DAT_001ae238 + uVar9 * 0x10);
  iVar7 = iVar5 + uVar3;
  iVar4 = iVar5 + uVar2;
  iVar5 = iVar5 + (uint)local_2c.field_0.b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar7;
  cVar8 = (component_t)iVar4;
  if (0xfe < iVar4) {
    cVar8 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar8;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  cVar8 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar8 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar8;
  pDst[2].field_0.field_0.a = 0xff;
  iVar7 = *(int *)(&DAT_001ae23c + uVar9 * 0x10);
  iVar4 = uVar3 + iVar7;
  iVar5 = uVar2 + iVar7;
  iVar7 = iVar7 + (uint)local_2c.field_0.b;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pDst[3].field_0.field_0.r = (component_t)iVar4;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  pDst[3].field_0.field_0.g = (component_t)iVar5;
  pDst[3].field_0.field_0.b = (component_t)iVar7;
  pDst[3].field_0.field_0.a = 0xff;
  return bVar1;
}

Assistant:

bool etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint16 packed_delta3, uint table_idx)
        {
            RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
            const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

            uint r, g, b;
            bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

            const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

            const int y0 = pInten_modifer_table[0];
            pDst[0].set(ir + y0, ig + y0, ib + y0);

            const int y1 = pInten_modifer_table[1];
            pDst[1].set(ir + y1, ig + y1, ib + y1);

            const int y2 = pInten_modifer_table[2];
            pDst[2].set(ir + y2, ig + y2, ib + y2);

            const int y3 = pInten_modifer_table[3];
            pDst[3].set(ir + y3, ig + y3, ib + y3);

            return success;
        }